

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_init_cfitsio(void)

{
  int iVar1;
  char *err_message;
  
  if (need_to_initialize == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = fits_register_driver
                      ("file://",file_init,file_shutdown,file_setoptions,file_getoptions,
                       file_getversion,file_checkfile,file_open,file_create,file_truncate,file_close
                       ,file_remove,file_size,file_flush,file_seek,file_read,file_write);
    if (iVar1 == 0) {
      iVar1 = fits_register_driver
                        ("mem://",mem_init,mem_shutdown,mem_setoptions,mem_getoptions,mem_getversion
                         ,(_func_int_char_ptr_char_ptr_char_ptr *)0x0,
                         (_func_int_char_ptr_int_int_ptr *)0x0,mem_create,mem_truncate,
                         mem_close_free,(_func_int_char_ptr *)0x0,mem_size,(_func_int_int *)0x0,
                         mem_seek,mem_read,mem_write);
      if (iVar1 == 0) {
        iVar1 = fits_register_driver
                          ("memkeep://",(_func_int *)0x0,mem_shutdown,mem_setoptions,mem_getoptions,
                           mem_getversion,(_func_int_char_ptr_char_ptr_char_ptr *)0x0,
                           (_func_int_char_ptr_int_int_ptr *)0x0,(_func_int_char_ptr_int_ptr *)0x0,
                           mem_truncate,mem_close_keep,(_func_int_char_ptr *)0x0,mem_size,
                           (_func_int_int *)0x0,mem_seek,mem_read,mem_write);
        if (iVar1 == 0) {
          iVar1 = fits_register_driver
                            ("stdin://",(_func_int *)0x0,mem_shutdown,mem_setoptions,mem_getoptions,
                             mem_getversion,stdin_checkfile,stdin_open,
                             (_func_int_char_ptr_int_ptr *)0x0,mem_truncate,mem_close_free,
                             (_func_int_char_ptr *)0x0,mem_size,(_func_int_int *)0x0,mem_seek,
                             mem_read,mem_write);
          if (iVar1 == 0) {
            iVar1 = fits_register_driver
                              ("stdinfile://",(_func_int *)0x0,mem_shutdown,mem_setoptions,
                               mem_getoptions,mem_getversion,
                               (_func_int_char_ptr_char_ptr_char_ptr *)0x0,stdin_open,
                               (_func_int_char_ptr_int_ptr *)0x0,file_truncate,file_close,
                               file_remove,file_size,file_flush,file_seek,file_read,file_write);
            if (iVar1 == 0) {
              iVar1 = fits_register_driver
                                ("stdout://",(_func_int *)0x0,mem_shutdown,mem_setoptions,
                                 mem_getoptions,mem_getversion,
                                 (_func_int_char_ptr_char_ptr_char_ptr *)0x0,
                                 (_func_int_char_ptr_int_int_ptr *)0x0,mem_create,mem_truncate,
                                 stdout_close,(_func_int_char_ptr *)0x0,mem_size,
                                 (_func_int_int *)0x0,mem_seek,mem_read,mem_write);
              if (iVar1 == 0) {
                iVar1 = fits_register_driver
                                  ("irafmem://",(_func_int *)0x0,mem_shutdown,mem_setoptions,
                                   mem_getoptions,mem_getversion,
                                   (_func_int_char_ptr_char_ptr_char_ptr *)0x0,mem_iraf_open,
                                   (_func_int_char_ptr_int_ptr *)0x0,mem_truncate,mem_close_free,
                                   (_func_int_char_ptr *)0x0,mem_size,(_func_int_int *)0x0,mem_seek,
                                   mem_read,mem_write);
                if (iVar1 == 0) {
                  iVar1 = fits_register_driver
                                    ("rawfile://",(_func_int *)0x0,mem_shutdown,mem_setoptions,
                                     mem_getoptions,mem_getversion,
                                     (_func_int_char_ptr_char_ptr_char_ptr *)0x0,mem_rawfile_open,
                                     (_func_int_char_ptr_int_ptr *)0x0,mem_truncate,mem_close_free,
                                     (_func_int_char_ptr *)0x0,mem_size,(_func_int_int *)0x0,
                                     mem_seek,mem_read,mem_write);
                  if (iVar1 == 0) {
                    iVar1 = fits_register_driver
                                      ("compress://",(_func_int *)0x0,mem_shutdown,mem_setoptions,
                                       mem_getoptions,mem_getversion,
                                       (_func_int_char_ptr_char_ptr_char_ptr *)0x0,mem_compress_open
                                       ,(_func_int_char_ptr_int_ptr *)0x0,mem_truncate,
                                       mem_close_free,(_func_int_char_ptr *)0x0,mem_size,
                                       (_func_int_int *)0x0,mem_seek,mem_read,mem_write);
                    if (iVar1 == 0) {
                      iVar1 = fits_register_driver
                                        ("compressmem://",(_func_int *)0x0,mem_shutdown,
                                         mem_setoptions,mem_getoptions,mem_getversion,
                                         (_func_int_char_ptr_char_ptr_char_ptr *)0x0,
                                         mem_compress_openrw,(_func_int_char_ptr_int_ptr *)0x0,
                                         mem_truncate,mem_close_free,(_func_int_char_ptr *)0x0,
                                         mem_size,(_func_int_int *)0x0,mem_seek,mem_read,mem_write);
                      if (iVar1 == 0) {
                        iVar1 = fits_register_driver
                                          ("compressfile://",(_func_int *)0x0,file_shutdown,
                                           file_setoptions,file_getoptions,file_getversion,
                                           (_func_int_char_ptr_char_ptr_char_ptr *)0x0,
                                           file_compress_open,file_create,file_truncate,file_close,
                                           file_remove,file_size,file_flush,file_seek,file_read,
                                           file_write);
                        if (iVar1 == 0) {
                          iVar1 = fits_register_driver
                                            ("compressoutfile://",(_func_int *)0x0,mem_shutdown,
                                             mem_setoptions,mem_getoptions,mem_getversion,
                                             (_func_int_char_ptr_char_ptr_char_ptr *)0x0,
                                             (_func_int_char_ptr_int_int_ptr *)0x0,mem_create_comp,
                                             mem_truncate,mem_close_comp,file_remove,mem_size,
                                             (_func_int_int *)0x0,mem_seek,mem_read,mem_write);
                          if (iVar1 == 0) {
                            iVar1 = fits_register_driver
                                              ("stream://",(_func_int *)0x0,(_func_int *)0x0,
                                               (_func_int_int *)0x0,(_func_int_int_ptr *)0x0,
                                               (_func_int_int_ptr *)0x0,
                                               (_func_int_char_ptr_char_ptr_char_ptr *)0x0,
                                               stream_open,stream_create,
                                               (_func_int_int_LONGLONG *)0x0,stream_close,
                                               (_func_int_char_ptr *)0x0,stream_size,stream_flush,
                                               stream_seek,stream_read,stream_write);
                            if (iVar1 != 0) {
                              ffpmsg("failed to register the stream:// driver (init_cfitsio)");
                              return iVar1;
                            }
                            need_to_initialize = 0;
                            return 0;
                          }
                          err_message = 
                          "failed to register the compressoutfile:// driver (init_cfitsio)";
                        }
                        else {
                          err_message = 
                          "failed to register the compressfile:// driver (init_cfitsio)";
                        }
                      }
                      else {
                        err_message = "failed to register the compressmem:// driver (init_cfitsio)";
                      }
                    }
                    else {
                      err_message = "failed to register the compress:// driver (init_cfitsio)";
                    }
                  }
                  else {
                    err_message = "failed to register the rawfile:// driver (init_cfitsio)";
                  }
                }
                else {
                  err_message = "failed to register the irafmem:// driver (init_cfitsio)";
                }
              }
              else {
                err_message = "failed to register the stdout:// driver (init_cfitsio)";
              }
            }
            else {
              err_message = "failed to register the stdinfile:// driver (init_cfitsio)";
            }
          }
          else {
            err_message = "failed to register the stdin:// driver (init_cfitsio)";
          }
        }
        else {
          err_message = "failed to register the memkeep:// driver (init_cfitsio)";
        }
      }
      else {
        err_message = "failed to register the mem:// driver (init_cfitsio)";
      }
    }
    else {
      err_message = "failed to register the file:// driver (init_cfitsio)";
    }
    ffpmsg(err_message);
  }
  return iVar1;
}

Assistant:

int fits_init_cfitsio(void)
/*
  initialize anything that is required before using the CFITSIO routines
*/
{
    int status;

    union u_tag {
      short ival;
      char cval[2];
    } u;

    fitsio_init_lock();

    FFLOCK;   /* lockout other threads while executing this critical */
              /* section of code  */

    if (need_to_initialize == 0) { /* already initialized? */
      FFUNLOCK;
      return(0);
    }

    /*   test for correct byteswapping.   */

    u.ival = 1;
    if  ((BYTESWAPPED && u.cval[0] != 1) ||
         (BYTESWAPPED == FALSE && u.cval[1] != 1) )
    {
      printf ("\n!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
      printf(" Byteswapping is not being done correctly on this system.\n");
      printf(" Check the MACHINE and BYTESWAPPED definitions in fitsio2.h\n");
      printf(" Please report this problem to the CFITSIO developers.\n");
      printf(  "!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
      FFUNLOCK;
      return(1);
    }
    
    
    /*  test that LONGLONG is an 8 byte integer */
    
    if (sizeof(LONGLONG) != 8)
    {
      printf ("\n!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
      printf(" CFITSIO did not find an 8-byte long integer data type.\n");
      printf("   sizeof(LONGLONG) = %d\n",(int)sizeof(LONGLONG));
      printf(" Please report this problem to the CFITSIO developers.\n");
      printf(  "!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
      FFUNLOCK;
      return(1);
    }

    /* register the standard I/O drivers that are always available */

    /* 1--------------------disk file driver-----------------------*/
    status = fits_register_driver("file://", 
            file_init,
            file_shutdown,
            file_setoptions,
            file_getoptions, 
            file_getversion,
	    file_checkfile,
            file_open,
            file_create,
#ifdef HAVE_FTRUNCATE
            file_truncate,
#else
            NULL,   /* no file truncate function */
#endif
            file_close,
            file_remove,
            file_size,
            file_flush,
            file_seek,
            file_read,
            file_write);

    if (status)
    {
        ffpmsg("failed to register the file:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 2------------ output temporary memory file driver ----------------*/
    status = fits_register_driver("mem://", 
            mem_init,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */
            NULL,            /* open function not allowed */
            mem_create, 
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);


    if (status)
    {
        ffpmsg("failed to register the mem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 3--------------input pre-existing memory file driver----------------*/
    status = fits_register_driver("memkeep://", 
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */
            NULL,            /* file open driver function is not used */
            NULL,            /* create function not allowed */
            mem_truncate,
            mem_close_keep,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);


    if (status)
    {
        ffpmsg("failed to register the memkeep:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

   /* 4-------------------stdin stream driver----------------------*/
   /*  the stdin stream is copied to memory then opened in memory */

    status = fits_register_driver("stdin://", 
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            stdin_checkfile, 
            stdin_open,
            NULL,            /* create function not allowed */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the stdin:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

   /* 5-------------------stdin file stream driver----------------------*/
   /*  the stdin stream is copied to a disk file then the disk file is opened */

    status = fits_register_driver("stdinfile://", 
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            stdin_open,
            NULL,            /* create function not allowed */
#ifdef HAVE_FTRUNCATE
            file_truncate,
#else
            NULL,   /* no file truncate function */
#endif
            file_close,
            file_remove,
            file_size,
            file_flush,
            file_seek,
            file_read,
            file_write);

    if (status)
    {
        ffpmsg("failed to register the stdinfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }


    /* 6-----------------------stdout stream driver------------------*/
    status = fits_register_driver("stdout://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            NULL,            /* open function not required */
            mem_create, 
            mem_truncate,
            stdout_close,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the stdout:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 7------------------iraf disk file to memory driver -----------*/
    status = fits_register_driver("irafmem://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            mem_iraf_open,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the irafmem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 8------------------raw binary file to memory driver -----------*/
    status = fits_register_driver("rawfile://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            mem_rawfile_open,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the rawfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 9------------------compressed disk file to memory driver -----------*/
    status = fits_register_driver("compress://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            mem_compress_open,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the compress:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 10------------------compressed disk file to memory driver -----------*/
    /*  Identical to compress://, except it allows READWRITE access      */

    status = fits_register_driver("compressmem://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            mem_compress_openrw,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the compressmem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 11------------------compressed disk file to disk file driver -------*/
    status = fits_register_driver("compressfile://",
            NULL,
            file_shutdown,
            file_setoptions,
            file_getoptions, 
            file_getversion,
            NULL,            /* checkfile not needed */ 
            file_compress_open,
            file_create,
#ifdef HAVE_FTRUNCATE
            file_truncate,
#else
            NULL,   /* no file truncate function */
#endif
            file_close,
            file_remove,
            file_size,
            file_flush,
            file_seek,
            file_read,
            file_write);

    if (status)
    {
        ffpmsg("failed to register the compressfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 12---create file in memory, then compress it to disk file on close--*/
    status = fits_register_driver("compressoutfile://", 
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */
            NULL,            /* open function not allowed */
            mem_create_comp, 
            mem_truncate,
            mem_close_comp,
            file_remove,     /* delete existing compressed disk file */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);


    if (status)
    {
        ffpmsg(
        "failed to register the compressoutfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* Register Optional drivers */

#ifdef HAVE_NET_SERVICES

    /* 13--------------------root driver-----------------------*/

    status = fits_register_driver("root://",
				  root_init,
				  root_shutdown,
				  root_setoptions,
				  root_getoptions, 
				  root_getversion,
				  NULL,            /* checkfile not needed */ 
				  root_open,
				  root_create,
				  NULL,  /* No truncate possible */
				  root_close,
				  NULL,  /* No remove possible */
				  root_size,  /* no size possible */
				  root_flush,
				  root_seek, /* Though will always succeed */
				  root_read,
				  root_write);

    if (status)
    {
        ffpmsg("failed to register the root:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 14--------------------http  driver-----------------------*/
    status = fits_register_driver("http://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            http_checkfile,
            http_open,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the http:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 15--------------------http file driver-----------------------*/

    status = fits_register_driver("httpfile://",
            NULL,
            file_shutdown,
            file_setoptions,
            file_getoptions, 
            file_getversion,
            NULL,            /* checkfile not needed */ 
            http_file_open,
            file_create,
#ifdef HAVE_FTRUNCATE
            file_truncate,
#else
            NULL,   /* no file truncate function */
#endif
            file_close,
            file_remove,
            file_size,
            file_flush,
            file_seek,
            file_read,
            file_write);

    if (status)
    {
        ffpmsg("failed to register the httpfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 16--------------------http memory driver-----------------------*/
    /*  same as http:// driver, except memory file can be opened READWRITE */
    status = fits_register_driver("httpmem://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            http_checkfile,
            http_file_open,  /* this will simply call http_open */
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the httpmem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 17--------------------httpcompress file driver-----------------------*/

    status = fits_register_driver("httpcompress://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            http_compress_open,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the httpcompress:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }


    /* 18--------------------ftp driver-----------------------*/
    status = fits_register_driver("ftp://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            ftp_checkfile,
            ftp_open,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the ftp:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 19--------------------ftp file driver-----------------------*/
    status = fits_register_driver("ftpfile://",
            NULL,
            file_shutdown,
            file_setoptions,
            file_getoptions, 
            file_getversion,
            NULL,            /* checkfile not needed */ 
            ftp_file_open,
            file_create,
#ifdef HAVE_FTRUNCATE
            file_truncate,
#else
            NULL,   /* no file truncate function */
#endif
            file_close,
            file_remove,
            file_size,
            file_flush,
            file_seek,
            file_read,
            file_write);

    if (status)
    {
        ffpmsg("failed to register the ftpfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 20--------------------ftp mem driver-----------------------*/
    /*  same as ftp:// driver, except memory file can be opened READWRITE */
    status = fits_register_driver("ftpmem://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            ftp_checkfile,
            ftp_file_open,   /* this will simply call ftp_open */
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the ftpmem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 21--------------------ftp compressed file driver------------------*/
    status = fits_register_driver("ftpcompress://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            ftp_compress_open,
            0,            /* create function not required */
            mem_truncate,
            mem_close_free,
            0,            /* remove function not required */
            mem_size,
            0,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the ftpcompress:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }
      /* === End of net drivers section === */  
#endif

/* ==================== SHARED MEMORY DRIVER SECTION ======================= */

#ifdef HAVE_SHMEM_SERVICES

    /* 22--------------------shared memory driver-----------------------*/
    status = fits_register_driver("shmem://", 
            smem_init,
            smem_shutdown,
            smem_setoptions,
            smem_getoptions, 
            smem_getversion,
            NULL,            /* checkfile not needed */ 
            smem_open,
            smem_create,
            NULL,            /* truncate file not supported yet */ 
            smem_close,
            smem_remove,
            smem_size,
            smem_flush,
            smem_seek,
            smem_read,
            smem_write );

    if (status)
    {
        ffpmsg("failed to register the shmem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

#endif
/* ==================== END OF SHARED MEMORY DRIVER SECTION ================ */


#ifdef HAVE_GSIFTP
    /* 23--------------------gsiftp driver-----------------------*/
    status = fits_register_driver("gsiftp://",
            gsiftp_init,
            gsiftp_shutdown,
            gsiftp_setoptions,
            gsiftp_getoptions, 
            gsiftp_getversion,
            gsiftp_checkfile,
            gsiftp_open,
            gsiftp_create,
#ifdef HAVE_FTRUNCATE
            gsiftp_truncate,
#else
            NULL,
#endif
            gsiftp_close,
            NULL,            /* remove function not yet implemented */
            gsiftp_size,
            gsiftp_flush,
            gsiftp_seek,
            gsiftp_read,
            gsiftp_write);

    if (status)
    {
        ffpmsg("failed to register the gsiftp:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

#endif

    /* 24---------------stdin and stdout stream driver-------------------*/
    status = fits_register_driver("stream://", 
            NULL,
            NULL,
            NULL,
            NULL, 
            NULL,
	    NULL,
            stream_open,
            stream_create,
            NULL,   /* no stream truncate function */
            stream_close,
            NULL,   /* no stream remove */
            stream_size,
            stream_flush,
            stream_seek,
            stream_read,
            stream_write);

    if (status)
    {
        ffpmsg("failed to register the stream:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

#ifdef HAVE_NET_SERVICES

    /* 25--------------------https  driver-----------------------*/
    status = fits_register_driver("https://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            https_checkfile,
            https_open,
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the https:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 26--------------------https file driver-----------------------*/

    status = fits_register_driver("httpsfile://",
            NULL,
            file_shutdown,
            file_setoptions,
            file_getoptions, 
            file_getversion,
            NULL,            /* checkfile not needed */ 
            https_file_open,
            file_create,
#ifdef HAVE_FTRUNCATE
            file_truncate,
#else
            NULL,   /* no file truncate function */
#endif
            file_close,
            file_remove,
            file_size,
            file_flush,
            file_seek,
            file_read,
            file_write);

    if (status)
    {
        ffpmsg("failed to register the httpsfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 27--------------------https memory driver-----------------------*/
    /*  same as https:// driver, except memory file can be opened READWRITE */
    status = fits_register_driver("httpsmem://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            https_checkfile,
            https_file_open,  /* this will simply call https_open */
            NULL,            /* create function not required */
            mem_truncate,
            mem_close_free,
            NULL,            /* remove function not required */
            mem_size,
            NULL,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the httpsmem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }
      /* === End of https net drivers section === */  

    /* 28--------------------ftps  driver-----------------------*/
    status = fits_register_driver("ftps://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            ftps_checkfile,
            ftps_open,
            NULL,            
            mem_truncate,
            mem_close_free,
            NULL,            
            mem_size,
            NULL,            
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the ftps:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 29--------------------ftps file driver-----------------------*/

    status = fits_register_driver("ftpsfile://",
            NULL,
            file_shutdown,
            file_setoptions,
            file_getoptions, 
            file_getversion,
            NULL,             
            ftps_file_open,
            file_create,
#ifdef HAVE_FTRUNCATE
            file_truncate,
#else
            NULL,   
#endif
            file_close,
            file_remove,
            file_size,
            file_flush,
            file_seek,
            file_read,
            file_write);

    if (status)
    {
        ffpmsg("failed to register the ftpsfile:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 30--------------------ftps memory driver-----------------------*/
    /*  same as ftps:// driver, except memory file can be opened READWRITE */
    status = fits_register_driver("ftpsmem://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            ftps_checkfile,
            ftps_file_open,  
            NULL,            
            mem_truncate,
            mem_close_free,
            NULL,           
            mem_size,
            NULL,            
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the ftpsmem:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }

    /* 31--------------------ftps compressed file driver------------------*/
    status = fits_register_driver("ftpscompress://",
            NULL,
            mem_shutdown,
            mem_setoptions,
            mem_getoptions, 
            mem_getversion,
            NULL,            /* checkfile not needed */ 
            ftps_compress_open,
            0,            /* create function not required */
            mem_truncate,
            mem_close_free,
            0,            /* remove function not required */
            mem_size,
            0,            /* flush function not required */
            mem_seek,
            mem_read,
            mem_write);

    if (status)
    {
        ffpmsg("failed to register the ftpscompress:// driver (init_cfitsio)");
        FFUNLOCK;
        return(status);
    }
#endif


    /* reset flag.  Any other threads will now not need to call this routine */
    need_to_initialize = 0;

    FFUNLOCK;
    return(status);
}